

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

PC * __thiscall Hpipe::Context::keep_up_to(PC *__return_storage_ptr__,Context *this,uint n)

{
  uint i;
  uint ind;
  PcMaker pm;
  
  anon_unknown_7::PcMaker::PcMaker(&pm,this);
  for (ind = 0; ind <= n; ind = ind + 1) {
    anon_unknown_7::PcMaker::add
              (&pm,(this->pos).
                   super_vector<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>.
                   super__Vector_base<const_Hpipe::CharItem_*,_std::allocator<const_Hpipe::CharItem_*>_>
                   ._M_impl.super__Vector_impl_data._M_start[ind],ind,true);
  }
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair(__return_storage_ptr__,&pm.res);
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&pm.res);
  return __return_storage_ptr__;
}

Assistant:

Context::PC Context::keep_up_to( unsigned n ) const {
    PcMaker pm( this );

    for( unsigned i = 0; i <= n; ++i )
        pm.add( pos[ i ], i );

    return pm.out();
}